

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O3

void CB_ALGS::output_example(vw *all,cb *data,example *ec,label *ld)

{
  uint32_t uVar1;
  int iVar2;
  shared_data *this;
  int *piVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  cb_class *pcVar9;
  ostream *poVar10;
  ulong uVar11;
  wclass *pwVar12;
  uint uVar13;
  int *piVar14;
  float fVar15;
  stringstream outputStringStream;
  undefined4 in_stack_fffffffffffffe18;
  undefined1 *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  cVar6 = (*(code *)PTR_test_label_002dab00)(ld);
  fVar15 = 0.0;
  if (cVar6 == '\0') {
    pcVar9 = (data->cbcs).known_cost;
    uVar1 = (ec->pred).multiclass;
    for (pwVar12 = (data->cbcs).pred_scores.costs._begin;
        pwVar12 != (data->cbcs).pred_scores.costs._end; pwVar12 = pwVar12 + 1) {
      if (pwVar12->class_index == uVar1) {
        fVar15 = 0.0;
        if (pcVar9->action == uVar1) {
          fVar15 = (pcVar9->cost - pwVar12->x) / pcVar9->probability;
        }
        fVar15 = pwVar12->x + fVar15;
        goto LAB_002533e9;
      }
    }
    if (pcVar9->action == uVar1) {
      fVar15 = pcVar9->cost / pcVar9->probability;
    }
  }
LAB_002533e9:
  this = all->sd;
  bVar8 = ec->test_only;
  bVar7 = (*(code *)PTR_test_label_002dab00)(ld);
  shared_data::update(this,bVar8,(bool)(bVar7 ^ 1),fVar15,1.0,ec->num_features);
  piVar14 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  if (piVar14 != piVar3) {
    do {
      (*all->print)(*piVar14,(float)(ec->pred).multiclass,0.0,ec->tag);
      piVar14 = piVar14 + 1;
    } while (piVar14 != piVar3);
  }
  if (0 < all->raw_prediction) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar9 = (ld->costs)._begin;
    if ((ld->costs)._end != pcVar9) {
      uVar13 = 1;
      uVar11 = 0;
      do {
        fVar15 = pcVar9[uVar11].partial_prediction;
        if (uVar13 != 1) {
          in_stack_fffffffffffffe18 = CONCAT13(0x20,(int3)in_stack_fffffffffffffe18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,&stack0xfffffffffffffe1b,1);
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        in_stack_fffffffffffffe18 = CONCAT13(0x3a,(int3)in_stack_fffffffffffffe18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffe1b,1);
        std::ostream::_M_insert<double>((double)fVar15);
        uVar11 = (ulong)uVar13;
        pcVar9 = (ld->costs)._begin;
        uVar13 = uVar13 + 1;
      } while (uVar11 < (ulong)((long)(ld->costs)._end - (long)pcVar9 >> 4));
    }
    p_Var4 = all->print_text;
    iVar2 = all->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar5._begin._4_4_ = fVar15;
    vVar5._begin._0_4_ = in_stack_fffffffffffffe18;
    vVar5._end = (char *)ec;
    vVar5.end_array = in_stack_fffffffffffffe28;
    vVar5.erase_count = in_stack_fffffffffffffe30;
    (*p_Var4)(iVar2,(string)ec->tag,vVar5);
    if (in_stack_fffffffffffffe28 != local_1c8) {
      operator_delete(in_stack_fffffffffffffe28);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  bVar8 = (bool)(*(code *)PTR_test_label_002dab00)(ld);
  CB::print_update(all,bVar8,ec,(multi_ex *)0x0,false);
  return;
}

Assistant:

void output_example(vw& all, cb& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;
  if (!CB::cb_label.test_label(&ld))
    loss = get_unbiased_cost(c.known_cost, c.pred_scores, ec.pred.multiclass);

  all.sd->update(ec.test_only, !CB::cb_label.test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      cb_class cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.action << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, CB::cb_label.test_label(&ld), ec, nullptr, false);
}